

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieparser.cpp
# Opt level: O2

void __thiscall
LottieParserImpl::parsePropertyHelper<VPointF,void>
          (LottieParserImpl *this,Property<VPointF,_void> *obj)

{
  bool bVar1;
  int iVar2;
  Animation *obj_00;
  
  iVar2 = PeekType(this);
  if (iVar2 == 6) {
    if (obj->isValue_ != false) {
      getValue(this,(VPointF *)obj);
      return;
    }
LAB_0013572a:
    (this->super_LookaheadParserHandler).st_ = kError;
    return;
  }
  EnterArray(this);
  do {
    bVar1 = NextArrayValue(this);
    if (!bVar1) {
LAB_0013571b:
      rlottie::internal::model::Property<VPointF,_void>::cache(obj);
      return;
    }
    iVar2 = PeekType(this);
    if (iVar2 != 3) {
      if (obj->isValue_ == false) goto LAB_0013572a;
      getValue(this,(VPointF *)obj);
      goto LAB_0013571b;
    }
    obj_00 = rlottie::internal::model::Property<VPointF,_void>::animation(obj);
    parseKeyFrame<VPointF,void>(this,obj_00);
  } while( true );
}

Assistant:

void LottieParserImpl::parsePropertyHelper(model::Property<T, Tag> &obj)
{
    if (PeekType() == kNumberType) {
        if (!obj.isStatic()) {
            st_ = kError;
            return;
        }
        /*single value property with no animation*/
        getValue(obj.value());
    } else {
        EnterArray();
        while (NextArrayValue()) {
            /* property with keyframe info*/
            if (PeekType() == kObjectType) {
                parseKeyFrame(obj.animation());
            } else {
                /* Read before modifying.
                 * as there is no way of knowing if the
                 * value of the array is either array of numbers
                 * or array of object without entering the array
                 * thats why this hack is there
                 */
                if (!obj.isStatic()) {
                    st_ = kError;
                    return;
                }
                /*multi value property with no animation*/
                getValue(obj.value());
                /*break here as we already reached end of array*/
                break;
            }
        }
        obj.cache();
    }
}